

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

bool __thiscall
google::protobuf::Reflection::InsertOrLookupMapValue
          (Reflection *this,Message *message,FieldDescriptor *field,MapKey *key,MapValueRef *val)

{
  bool bVar1;
  CppType type;
  Descriptor *this_00;
  FieldDescriptor *this_01;
  MapFieldBase *this_02;
  MapValueRef *val_local;
  MapKey *key_local;
  FieldDescriptor *field_local;
  Message *message_local;
  Reflection *this_local;
  
  bVar1 = anon_unknown_6::IsMapFieldInApi(field);
  if (!bVar1) {
    anon_unknown_6::ReportReflectionUsageError
              (this->descriptor_,field,"InsertOrLookupMapValue","Field is not a map field.");
  }
  this_00 = FieldDescriptor::message_type(field);
  this_01 = Descriptor::map_value(this_00);
  type = FieldDescriptor::cpp_type(this_01);
  MapValueConstRef::SetType(&val->super_MapValueConstRef,type);
  this_02 = MutableRaw<google::protobuf::internal::MapFieldBase>(this,message,field);
  bVar1 = internal::MapFieldBase::InsertOrLookupMapValue(this_02,key,val);
  return bVar1;
}

Assistant:

bool Reflection::InsertOrLookupMapValue(Message* message,
                                        const FieldDescriptor* field,
                                        const MapKey& key,
                                        MapValueRef* val) const {
  USAGE_CHECK(IsMapFieldInApi(field), InsertOrLookupMapValue,
              "Field is not a map field.");
  val->SetType(field->message_type()->map_value()->cpp_type());
  return MutableRaw<MapFieldBase>(message, field)
      ->InsertOrLookupMapValue(key, val);
}